

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_impl.h
# Opt level: O3

RcImplApiService * RcImplApiService::get_instance(void)

{
  pthread_mutex_t *__mutex;
  
  if (get_instance()::instance == '\0') {
    get_instance();
  }
  __mutex = (pthread_mutex_t *)get_lock();
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
    pthread_mutex_unlock(__mutex);
  }
  return &get_instance::instance;
}

Assistant:

static RcImplApiService *get_instance() {
        static RcImplApiService instance;
        AutoMutex auto_lock(get_lock());
        return &instance;
    }